

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GIC.h
# Opt level: O1

void __thiscall
Gudhi::cover_complex::Cover_complex<std::vector<float,_std::allocator<float>_>_>::remove_edges
          (Cover_complex<std::vector<float,_std::allocator<float>_>_> *this,Graph *G)

{
  Graph *pGVar1;
  edge_descriptor e;
  
  for (pGVar1 = *(Graph **)
                 &(G->m_graph).super_type.m_edges.
                  super__List_base<boost::list_edge<unsigned_long,_boost::property<boost::edge_index_t,_int,_boost::property<boost::edge_weight_t,_double,_boost::no_property>_>_>,_std::allocator<boost::list_edge<unsigned_long,_boost::property<boost::edge_index_t,_int,_boost::property<boost::edge_weight_t,_double,_boost::no_property>_>_>_>_>
                  ._M_impl._M_node.super__List_node_base; pGVar1 != G;
      pGVar1 = *(Graph **)
                &(pGVar1->m_graph).super_type.m_edges.
                 super__List_base<boost::list_edge<unsigned_long,_boost::property<boost::edge_index_t,_int,_boost::property<boost::edge_weight_t,_double,_boost::no_property>_>_>,_std::allocator<boost::list_edge<unsigned_long,_boost::property<boost::edge_index_t,_int,_boost::property<boost::edge_weight_t,_double,_boost::no_property>_>_>_>_>
                 ._M_impl._M_node.super__List_node_base) {
    e.m_eproperty =
         &(pGVar1->m_graph).super_type.m_vertices.
          super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_index_t,_int,_boost::property<boost::edge_weight_t,_double,_boost::no_property>_>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_index_t,_int,_boost::property<boost::edge_weight_t,_double,_boost::no_property>_>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_index_t,_int,_boost::property<boost::edge_weight_t,_double,_boost::no_property>_>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_index_t,_int,_boost::property<boost::edge_weight_t,_double,_boost::no_property>_>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
          ._M_impl.super__Vector_impl_data._M_finish;
    e.super_edge_base<boost::undirected_tag,_unsigned_long> =
         *(edge_base<boost::undirected_tag,_unsigned_long> *)
          &(pGVar1->m_graph).super_type.m_edges.
           super__List_base<boost::list_edge<unsigned_long,_boost::property<boost::edge_index_t,_int,_boost::property<boost::edge_weight_t,_double,_boost::no_property>_>_>,_std::allocator<boost::list_edge<unsigned_long,_boost::property<boost::edge_index_t,_int,_boost::property<boost::edge_weight_t,_double,_boost::no_property>_>_>_>_>
           ._M_impl._M_node._M_size;
    boost::
    remove_edge<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,boost::no_property,boost::property<boost::edge_index_t,int,boost::property<boost::edge_weight_t,double,boost::no_property>>,boost::no_property,boost::listS>>
              (e,G);
  }
  return;
}

Assistant:

void remove_edges(Graph& G) {
    boost::graph_traits<Graph>::edge_iterator ei, ei_end;
    for (boost::tie(ei, ei_end) = boost::edges(G); ei != ei_end; ++ei) boost::remove_edge(*ei, G);
  }